

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_global_hold_socket(nn_sock **sockp,int s)

{
  int iVar1;
  int in_ESI;
  nn_sock **in_RDI;
  int rc;
  undefined4 in_stack_fffffffffffffff0;
  
  nn_mutex_lock((nn_mutex_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  iVar1 = nn_global_hold_socket_locked(in_RDI,in_ESI);
  nn_mutex_unlock((nn_mutex_t *)CONCAT44(in_ESI,iVar1));
  return iVar1;
}

Assistant:

int nn_global_hold_socket(struct nn_sock **sockp, int s)
{
    int rc;
    nn_mutex_lock(&self.lock);
    rc = nn_global_hold_socket_locked(sockp, s);
    nn_mutex_unlock(&self.lock);
    return rc;
}